

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testRunStarting(ConsoleReporter *this,TestRunInfo *_testInfo)

{
  StreamingReporterBase<Catch::ConsoleReporter> *in_RSI;
  TestRunInfo *in_RDI;
  ConsoleReporter *in_stack_00000040;
  
  StreamingReporterBase<Catch::ConsoleReporter>::testRunStarting(in_RSI,in_RDI);
  printTestFilters(in_stack_00000040);
  return;
}

Assistant:

void ConsoleReporter::testRunStarting(TestRunInfo const& _testInfo) {
    StreamingReporterBase::testRunStarting(_testInfo);
    printTestFilters();
}